

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void regenerateSHBuffer(void)

{
  code *pcVar1;
  reference v;
  reference pvVar2;
  long lVar3;
  float *pfVar4;
  float fVar5;
  undefined1 local_1c [8];
  vec3 pos;
  int n;
  Perf stat;
  
  Perf::Perf((Perf *)((long)&pos.field_0 + 0xb),"Regenerate SH Buffer");
  std::vector<float,_std::allocator<float>_>::resize(&legendre_scalars,vertex_count * 9);
  for (pos.field_0.field_0.y = 0.0; (ulong)(long)(int)pos.field_0.field_0.y < vertex_count;
      pos.field_0.field_0.y = (value_type)((int)pos.field_0.field_0.y + 1)) {
    v = std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::
        operator[](&sphere_positions,(long)(int)pos.field_0.field_0.y);
    glm::detail::tvec3<float>::tvec3((tvec3<float> *)local_1c,v);
    fVar5 = legendre_0_0((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y);
    *pvVar2 = fVar5;
    fVar5 = legendre_1_0((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count);
    *pvVar2 = fVar5;
    fVar5 = legendre_1_1((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 2);
    *pvVar2 = fVar5;
    fVar5 = legendre_1_2((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 3);
    *pvVar2 = fVar5;
    fVar5 = legendre_2_0((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 4);
    *pvVar2 = fVar5;
    fVar5 = legendre_2_1((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 5);
    *pvVar2 = fVar5;
    fVar5 = legendre_2_2((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 6);
    *pvVar2 = fVar5;
    fVar5 = legendre_2_3((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 7);
    *pvVar2 = fVar5;
    fVar5 = legendre_2_4((vec3 *)local_1c);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&legendre_scalars,(long)(int)pos.field_0.field_0.y + vertex_count * 8);
    *pvVar2 = fVar5;
  }
  (*__glewBindBuffer)(0x8892,legendre_buffer);
  pcVar1 = __glewBufferData;
  lVar3 = vertex_count * 0x24;
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(&legendre_scalars);
  (*pcVar1)(0x8892,lVar3,pfVar4,0x88e4);
  return;
}

Assistant:

void regenerateSHBuffer() {
    Perf stat("Regenerate SH Buffer");
    legendre_scalars.resize(9 * vertex_count);
    for (int n = 0; n < vertex_count; n++) {
        vec3 pos = sphere_positions[n];
        legendre_scalars[n + 0*vertex_count] = legendre_0_0(pos);
        legendre_scalars[n + 1*vertex_count] = legendre_1_0(pos);
        legendre_scalars[n + 2*vertex_count] = legendre_1_1(pos);
        legendre_scalars[n + 3*vertex_count] = legendre_1_2(pos);
        legendre_scalars[n + 4*vertex_count] = legendre_2_0(pos);
        legendre_scalars[n + 5*vertex_count] = legendre_2_1(pos);
        legendre_scalars[n + 6*vertex_count] = legendre_2_2(pos);
        legendre_scalars[n + 7*vertex_count] = legendre_2_3(pos);
        legendre_scalars[n + 8*vertex_count] = legendre_2_4(pos);
    }

    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    glBufferData(GL_ARRAY_BUFFER, vertex_count * sizeof(float) * 9, legendre_scalars.data(), GL_STATIC_DRAW);
}